

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void * duckdb_je_arena_ralloc
                 (tsdn_t *tsdn,arena_t *arena,void *ptr,size_t oldsize,size_t size,size_t alignment,
                 _Bool zero,_Bool slab,tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  cache_bin_stats_t *pcVar1;
  ushort uVar2;
  void **ppvVar3;
  long lVar4;
  _Bool _Var5;
  uint binind;
  szind_t binind_00;
  ulong uVar6;
  void *pvVar7;
  arena_t *arena_00;
  void **ppvVar8;
  size_t sVar9;
  size_t size_00;
  ulong uVar10;
  cache_bin_t *bin;
  cache_bin_t *pcVar11;
  rtree_t *rtree;
  arena_t *local_1e8;
  rtree_contents_t local_1c8;
  size_t newsize;
  
  if (alignment == 0) {
    if (size < 0x1001) {
      size_00 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) {
        return (void *)0x0;
      }
      uVar6 = size * 2 - 1;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar6 = -1L << (0x3c - ((byte)lVar4 ^ 0x3f) & 0x3f);
      size_00 = ~uVar6 + size & uVar6;
    }
  }
  else {
    if (alignment < 0x1001 && size < 0x3801) {
      uVar6 = -alignment & (alignment + size) - 1;
      if (uVar6 < 0x1001) {
        size_00 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar6 + 7 >> 3]];
      }
      else {
        uVar10 = uVar6 * 2 - 1;
        lVar4 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        uVar10 = -1L << (0x3c - ((byte)lVar4 ^ 0x3f) & 0x3f);
        size_00 = ~uVar10 + uVar6 & uVar10;
      }
      uVar6 = 0x4000;
      if (size_00 < 0x4000) goto LAB_001ed788;
    }
    else {
      if (0x7000000000000000 < alignment) {
        return (void *)0x0;
      }
      uVar6 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar6 = size * 2 - 1;
          lVar4 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          uVar6 = -1L << (0x3c - ((byte)lVar4 ^ 0x3f) & 0x3f);
          uVar6 = ~uVar6 + size & uVar6;
        }
        else {
          uVar6 = 0;
        }
        if (uVar6 < size) {
          return (void *)0x0;
        }
      }
    }
    size_00 = 0;
    if (uVar6 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar6) -
                 0x1000) {
      size_00 = uVar6;
    }
  }
LAB_001ed788:
  if (0x7000000000000000 < size) {
    return (void *)0x0;
  }
  if (size_00 == 0) {
    return (void *)0x0;
  }
  if ((slab) &&
     (_Var5 = duckdb_je_arena_ralloc_no_move(tsdn,ptr,oldsize,size_00,0,zero,&newsize), !_Var5)) {
    duckdb_je_hook_invoke_expand
              (hook_args->is_realloc ^ hook_expand_rallocx,ptr,oldsize,size_00,(uintptr_t)ptr,
               hook_args->args);
    return ptr;
  }
  if ((0x3fff < oldsize) && (0x3fff < size_00)) {
    pvVar7 = duckdb_je_large_ralloc(tsdn,arena,ptr,size_00,alignment,zero,tcache,hook_args);
    return pvVar7;
  }
  if (alignment == 0) {
    if (size_00 < 0x1001) {
      binind_00 = (szind_t)duckdb_je_sz_size2index_tab[size_00 + 7 >> 3];
    }
    else {
      binind_00 = sz_size2index_compute(size_00);
    }
    local_1e8 = arena;
    if (tcache == (tcache_t *)0x0) {
LAB_001edcff:
      uVar6 = (ulong)(uint)zero;
      pvVar7 = duckdb_je_arena_malloc_hard(tsdn,local_1e8,size_00,binind_00,zero,slab);
    }
    else {
      uVar6 = (ulong)binind_00;
      if (slab) {
        pcVar11 = tcache->bins + uVar6;
        ppvVar3 = pcVar11->stack_head;
        pvVar7 = *ppvVar3;
        ppvVar8 = ppvVar3 + 1;
        uVar2 = tcache->bins[uVar6].low_bits_low_water;
        uVar10 = (ulong)uVar2;
        if (uVar2 == (ushort)ppvVar3) {
          if (tcache->bins[uVar6].low_bits_empty == uVar2) {
            local_1e8 = arena_choose(&tsdn->tsd,arena);
            if (local_1e8 == (arena_t *)0x0) {
              pvVar7 = (void *)0x0;
              uVar6 = uVar10;
              goto LAB_001eda1f;
            }
            if (pcVar11->stack_head == (void **)&duckdb_je_disabled_bin) {
              slab = true;
              goto LAB_001edcff;
            }
            duckdb_je_tcache_bin_flush_stashed(&tsdn->tsd,tcache,pcVar11,binind_00,true);
            uVar10 = (ulong)binind_00;
            pvVar7 = duckdb_je_tcache_alloc_small_hard
                               (tsdn,local_1e8,tcache,pcVar11,binind_00,(_Bool *)&newsize);
            if ((char)newsize == '\0') {
              return (void *)0x0;
            }
          }
          else {
            pcVar11->stack_head = ppvVar8;
            tcache->bins[uVar6].low_bits_low_water = (uint16_t)ppvVar8;
          }
        }
        else {
          pcVar11->stack_head = ppvVar8;
        }
        if (zero) {
          switchD_00569a20::default(pvVar7,0,duckdb_je_sz_index2size_tab[uVar6]);
        }
        pcVar1 = &tcache->bins[uVar6].tstats;
        pcVar1->nrequests = pcVar1->nrequests + 1;
        uVar6 = uVar10;
      }
      else {
        if ((tcache->tcache_slow->tcache_nbins <= binind_00) ||
           (ppvVar8 = tcache->bins[uVar6].stack_head, ppvVar8 == (void **)&duckdb_je_disabled_bin))
        goto LAB_001edcff;
        pcVar11 = tcache->bins + uVar6;
        pvVar7 = *ppvVar8;
        ppvVar3 = ppvVar8 + 1;
        if (pcVar11->low_bits_low_water == (uint16_t)ppvVar8) {
          if (pcVar11->low_bits_empty == pcVar11->low_bits_low_water) {
            arena_00 = arena_choose(&tsdn->tsd,arena);
            if (arena_00 == (arena_t *)0x0) {
              return (void *)0x0;
            }
            uVar6 = 0;
            duckdb_je_tcache_bin_flush_stashed(&tsdn->tsd,tcache,pcVar11,binind_00,false);
            if (size_00 < 0x1001) {
              sVar9 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size_00 + 7 >> 3]];
            }
            else if (size_00 < 0x7000000000000001) {
              uVar10 = size_00 * 2 - 1;
              lVar4 = 0x3f;
              if (uVar10 != 0) {
                for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
                }
              }
              uVar10 = -1L << (0x3c - ((byte)lVar4 ^ 0x3f) & 0x3f);
              sVar9 = ~uVar10 + size_00 & uVar10;
            }
            else {
              sVar9 = 0;
            }
            pvVar7 = duckdb_je_large_malloc(tsdn,arena_00,sVar9,zero);
            goto LAB_001eda1f;
          }
          pcVar11->stack_head = ppvVar3;
          pcVar11->low_bits_low_water = (uint16_t)ppvVar3;
        }
        else {
          pcVar11->stack_head = ppvVar3;
        }
        if (zero) {
          switchD_00569a20::default(pvVar7,0,duckdb_je_sz_index2size_tab[uVar6]);
        }
        (pcVar11->tstats).nrequests = (pcVar11->tstats).nrequests + 1;
      }
    }
  }
  else {
    if ((alignment < 0x1001) && (size_00 < 0x3801)) {
      uVar6 = -alignment & (alignment + size_00) - 1;
      if (uVar6 < 0x1001) {
        sVar9 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar6 + 7 >> 3]];
      }
      else {
        uVar10 = uVar6 * 2 - 1;
        lVar4 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        uVar10 = -1L << (0x3c - ((byte)lVar4 ^ 0x3f) & 0x3f);
        sVar9 = ~uVar10 + uVar6 & uVar10;
      }
      uVar6 = 0x4000;
      if (0x3fff < sVar9) goto LAB_001ed9b7;
    }
    else {
      uVar6 = 0x4000;
      if (0x4000 < size_00) {
        if (size_00 < 0x7000000000000001) {
          uVar6 = size_00 * 2 - 1;
          lVar4 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          uVar6 = -1L << (0x3c - ((byte)lVar4 ^ 0x3f) & 0x3f);
          uVar6 = ~uVar6 + size_00 & uVar6;
        }
        else {
          uVar6 = 0;
        }
        if (uVar6 < size_00) {
          return (void *)0x0;
        }
      }
LAB_001ed9b7:
      sVar9 = 0;
      if (uVar6 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar6) -
                   0x1000) {
        sVar9 = uVar6;
      }
    }
    if (sVar9 + 0x8fffffffffffffff < 0x9000000000000000) {
      return (void *)0x0;
    }
    uVar6 = (ulong)(uint)zero;
    pvVar7 = duckdb_je_arena_palloc(tsdn,arena,sVar9,alignment,zero,slab,tcache);
  }
LAB_001eda1f:
  if (pvVar7 == (void *)0x0) {
    return (void *)0x0;
  }
  duckdb_je_hook_invoke_alloc
            (hook_args->is_realloc ^ hook_alloc_rallocx,pvVar7,(uintptr_t)pvVar7,hook_args->args);
  duckdb_je_hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (oldsize <= size_00) {
    size_00 = oldsize;
  }
  switchD_00b041bd::default(pvVar7,ptr,size_00);
  if (tcache == (tcache_t *)0x0) {
    arena_sdalloc_no_tcache(tsdn,ptr,oldsize);
    return pvVar7;
  }
  if (oldsize < 0x1001) {
    binind = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
  }
  else {
    binind = sz_size2index_compute(oldsize);
  }
  if (binind < 0x24) {
    pcVar11 = tcache->bins + binind;
    ppvVar8 = pcVar11->stack_head;
    if (tcache->bins[binind].low_bits_full == (uint16_t)ppvVar8) {
      if (ppvVar8 == (void **)&duckdb_je_disabled_bin) {
        duckdb_je_arena_dalloc_small(tsdn,ptr);
        return pvVar7;
      }
      duckdb_je_tcache_bin_flush_small
                (&tsdn->tsd,tcache,pcVar11,binind,
                 (uint)(tcache->bins[binind].bin_info.ncached_max >>
                       ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_001edbf5:
      ppvVar8 = pcVar11->stack_head;
      if (pcVar11->low_bits_full != (uint16_t)ppvVar8) {
        pcVar11->stack_head = ppvVar8 + -1;
        ppvVar8[-1] = ptr;
        return pvVar7;
      }
      return pvVar7;
    }
LAB_001edad3:
    pcVar11->stack_head = ppvVar8 + -1;
    ppvVar8[-1] = ptr;
  }
  else {
    if (binind < tcache->tcache_slow->tcache_nbins) {
      ppvVar8 = tcache->bins[binind].stack_head;
      if (ppvVar8 != (void **)&duckdb_je_disabled_bin) {
        pcVar11 = tcache->bins + binind;
        if (tcache->bins[binind].low_bits_full == (uint16_t)ppvVar8) {
          duckdb_je_tcache_bin_flush_large
                    (&tsdn->tsd,tcache,pcVar11,binind,
                     (uint)(tcache->bins[binind].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
          goto LAB_001edbf5;
        }
        goto LAB_001edad3;
      }
    }
    if (tsdn == (tsdn_t *)0x0) {
      rtree = (rtree_t *)&newsize;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
    }
    else {
      rtree = (rtree_t *)
              &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1c8,tsdn,rtree,(rtree_ctx_t *)ptr,uVar6);
    duckdb_je_large_dalloc(tsdn,local_1c8.edata);
  }
  return pvVar7;
}

Assistant:

void *
arena_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t oldsize,
    size_t size, size_t alignment, bool zero, bool slab, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	size_t usize = alignment == 0 ? sz_s2u(size) : sz_sa2u(size, alignment);
	if (unlikely(usize == 0 || size > SC_LARGE_MAXCLASS)) {
		return NULL;
	}

	if (likely(slab)) {
		assert(sz_can_use_slab(usize));
		/* Try to avoid moving the allocation. */
		UNUSED size_t newsize;
		if (!arena_ralloc_no_move(tsdn, ptr, oldsize, usize, 0, zero,
		    &newsize)) {
			hook_invoke_expand(hook_args->is_realloc
			    ? hook_expand_realloc : hook_expand_rallocx,
			    ptr, oldsize, usize, (uintptr_t)ptr,
			    hook_args->args);
			return ptr;
		}
	}

	if (oldsize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS) {
		return large_ralloc(tsdn, arena, ptr, usize,
		    alignment, zero, tcache, hook_args);
	}

	/*
	 * size and oldsize are different enough that we need to move the
	 * object.  In that case, fall back to allocating new space and copying.
	 */
	void *ret = arena_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero, slab, tcache);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	/*
	 * Junk/zero-filling were already done by
	 * ipalloc()/arena_malloc().
	 */
	size_t copysize = (usize < oldsize) ? usize : oldsize;
	memcpy(ret, ptr, copysize);
	isdalloct(tsdn, ptr, oldsize, tcache, NULL, true);
	return ret;
}